

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

ssize_t __thiscall
wasm::StackIRToBinaryWriter::write(StackIRToBinaryWriter *this,int __fd,void *__buf,size_t __n)

{
  Index i;
  vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *this_00;
  WasmBinaryWriter *pWVar1;
  bool bVar2;
  reference ppSVar3;
  If *curr;
  uint *puVar4;
  Try *pTVar5;
  DebugLocation *pDVar6;
  ssize_t extraout_RAX;
  uint local_64;
  StackInst *local_60;
  StackInst *inst;
  iterator __end1;
  iterator __begin1;
  StackIR *__range1;
  SmallVector<unsigned_int,_4UL> catchIndexStack;
  StackIRToBinaryWriter *this_local;
  
  catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->func->prologLocation);
  if (bVar2) {
    pWVar1 = this->parent;
    pDVar6 = std::optional<wasm::Function::DebugLocation>::operator*(&this->func->prologLocation);
    WasmBinaryWriter::writeDebugLocation(pWVar1,pDVar6);
  }
  BinaryInstWriter::mapLocalsAndEmitHeader(&this->writer);
  SmallVector<unsigned_int,_4UL>::SmallVector((SmallVector<unsigned_int,_4UL> *)&__range1);
  this_00 = this->stackIR;
  __end1 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::begin(this_00);
  inst = (StackInst *)
         std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
                                *)&inst);
    if (!bVar2) {
      bVar2 = std::optional::operator_cast_to_bool((optional *)&this->func->epilogLocation);
      if (bVar2) {
        pWVar1 = this->parent;
        pDVar6 = std::optional<wasm::Function::DebugLocation>::operator*
                           (&this->func->epilogLocation);
        WasmBinaryWriter::writeDebugLocation(pWVar1,pDVar6);
      }
      else {
        WasmBinaryWriter::writeNoDebugLocation(this->parent);
      }
      BinaryInstWriter::emitFunctionEnd(&this->writer);
      SmallVector<unsigned_int,_4UL>::~SmallVector((SmallVector<unsigned_int,_4UL> *)&__range1);
      return extraout_RAX;
    }
    ppSVar3 = __gnu_cxx::
              __normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
              ::operator*(&__end1);
    local_60 = *ppSVar3;
    if (local_60 != (StackInst *)0x0) {
      switch(local_60->op) {
      case IfElse:
        curr = Expression::cast<wasm::If>(local_60->origin);
        BinaryInstWriter::emitIfElse(&this->writer,curr);
        break;
      case TryBegin:
        local_64 = 0;
        SmallVector<unsigned_int,_4UL>::push_back
                  ((SmallVector<unsigned_int,_4UL> *)&__range1,&local_64);
      case Basic:
      case BlockBegin:
      case IfBegin:
      case LoopBegin:
      case TryTableBegin:
        if ((this->sourceMap & 1U) != 0) {
          WasmBinaryWriter::writeDebugLocation(this->parent,local_60->origin,this->func);
        }
        BinaryInstWriter::visit(&this->writer,local_60->origin);
        if ((this->sourceMap & 1U) != 0) {
          WasmBinaryWriter::writeDebugLocationEnd(this->parent,local_60->origin,this->func);
        }
        break;
      case Catch:
        pTVar5 = Expression::cast<wasm::Try>(local_60->origin);
        puVar4 = SmallVector<unsigned_int,_4UL>::back((SmallVector<unsigned_int,_4UL> *)&__range1);
        i = *puVar4;
        *puVar4 = i + 1;
        BinaryInstWriter::emitCatch(&this->writer,pTVar5,i);
        break;
      case CatchAll:
        pTVar5 = Expression::cast<wasm::Try>(local_60->origin);
        BinaryInstWriter::emitCatchAll(&this->writer,pTVar5);
        break;
      case Delegate:
        pTVar5 = Expression::cast<wasm::Try>(local_60->origin);
        BinaryInstWriter::emitDelegate(&this->writer,pTVar5);
        SmallVector<unsigned_int,_4UL>::pop_back((SmallVector<unsigned_int,_4UL> *)&__range1);
        break;
      case TryEnd:
        SmallVector<unsigned_int,_4UL>::pop_back((SmallVector<unsigned_int,_4UL> *)&__range1);
      case BlockEnd:
      case IfEnd:
      case LoopEnd:
      case TryTableEnd:
        BinaryInstWriter::emitScopeEnd(&this->writer,local_60->origin);
        break;
      default:
        handle_unreachable("unexpected op",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0xcb5);
      }
    }
    __gnu_cxx::
    __normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void StackIRToBinaryWriter::write() {
  if (func->prologLocation) {
    parent.writeDebugLocation(*func->prologLocation);
  }
  writer.mapLocalsAndEmitHeader();
  // Stack to track indices of catches within a try
  SmallVector<Index, 4> catchIndexStack;
  for (auto* inst : stackIR) {
    if (!inst) {
      continue; // a nullptr is just something we can skip
    }
    switch (inst->op) {
      case StackInst::TryBegin:
        catchIndexStack.push_back(0);
        [[fallthrough]];
      case StackInst::Basic:
      case StackInst::BlockBegin:
      case StackInst::IfBegin:
      case StackInst::LoopBegin:
      case StackInst::TryTableBegin: {
        if (sourceMap) {
          parent.writeDebugLocation(inst->origin, func);
        }
        writer.visit(inst->origin);
        if (sourceMap) {
          parent.writeDebugLocationEnd(inst->origin, func);
        }
        break;
      }
      case StackInst::TryEnd:
        catchIndexStack.pop_back();
        [[fallthrough]];
      case StackInst::BlockEnd:
      case StackInst::IfEnd:
      case StackInst::LoopEnd:
      case StackInst::TryTableEnd: {
        writer.emitScopeEnd(inst->origin);
        break;
      }
      case StackInst::IfElse: {
        writer.emitIfElse(inst->origin->cast<If>());
        break;
      }
      case StackInst::Catch: {
        writer.emitCatch(inst->origin->cast<Try>(), catchIndexStack.back()++);
        break;
      }
      case StackInst::CatchAll: {
        writer.emitCatchAll(inst->origin->cast<Try>());
        break;
      }
      case StackInst::Delegate: {
        writer.emitDelegate(inst->origin->cast<Try>());
        // Delegates end the try, like a TryEnd.
        catchIndexStack.pop_back();
        break;
      }
      default:
        WASM_UNREACHABLE("unexpected op");
    }
  }
  // Indicate the debug location corresponding to the end opcode that
  // terminates the function code.
  if (func->epilogLocation) {
    parent.writeDebugLocation(*func->epilogLocation);
  } else {
    // The end opcode has no debug location.
    parent.writeNoDebugLocation();
  }
  writer.emitFunctionEnd();
}